

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyFileReader.cpp
# Opt level: O0

void __thiscall
KeyFileReader<NWN::ResRef16>::KeyFileReader
          (KeyFileReader<NWN::ResRef16> *this,string *FileName,string *InstallDir)

{
  char *__filename;
  FILE *__stream;
  runtime_error *prVar1;
  long lVar2;
  string *in_RSI;
  IResourceAccessor<NWN::ResRef32> *in_RDI;
  unsigned_long FileSize;
  HANDLE File;
  string *in_stack_000005f0;
  HANDLE in_stack_000005f8;
  KeyFileReader<NWN::ResRef16> *in_stack_00000600;
  
  IResourceAccessor<NWN::ResRef32>::IResourceAccessor(in_RDI);
  in_RDI->_vptr_IResourceAccessor = (_func_int **)&PTR_OpenFile_002990a0;
  std::
  vector<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
  ::vector((vector<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR,_std::allocator<KeyFileReader<NWN::ResRef16>::_KEY_RESOURCE_DESCRIPTOR>_>
            *)0x21e89f);
  std::
  vector<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>,_std::allocator<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>_>_>
  ::vector((vector<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>,_std::allocator<swutil::SharedPtr<BifFileReader<NWN::ResRef16>_>_>_>
            *)0x21e8b2);
  std::__cxx11::string::string((string *)(in_RDI + 7),in_RSI);
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Failed to open KEY file.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fseek(__stream,0,2);
  lVar2 = ftell(__stream);
  fseek(__stream,0,0);
  if (lVar2 == 0xffffffff) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"Failed to read file size.");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ParseKeyFile(in_stack_00000600,in_stack_000005f8,in_stack_000005f0);
  fclose(__stream);
  return;
}

Assistant:

KeyFileReader< ResRefT >::KeyFileReader(
	 const std::string & FileName,
	 const std::string & InstallDir
	)
/*++

Routine Description:

	This routine constructs a new KeyFileReader object and parses the contents
	of a KEY file by filename.  The file must already exist as it is
	immediately deserialized.

Arguments:

	FileName - Supplies the path to the KEY file.

	InstallDir - Supplies the installation directory to use for drive 0.  The
	             directory should have a trailing path separator character.
	             The install directory name need only remain valid until the
	             constructor returns.

Return Value:

	The newly constructed object.

Environment:

	User mode.

--*/
: m_KeyFileName( FileName )
{
    HANDLE        File;
    unsigned long FileSize;

#if defined(_WINDOWS)

	File = CreateFileA(
		FileName.c_str( ),
		GENERIC_READ,
		FILE_SHARE_READ | FILE_SHARE_DELETE,
		NULL,
		OPEN_EXISTING,
		FILE_ATTRIBUTE_NORMAL,
		NULL);

	if (File == INVALID_HANDLE_VALUE)
	{
		File = CreateFileA(
				FileName.c_str( ),
				GENERIC_READ,
				FILE_SHARE_READ,
				NULL,
				OPEN_EXISTING,
				FILE_ATTRIBUTE_NORMAL,
				NULL);

		if (File == INVALID_HANDLE_VALUE)
			throw std::exception( "Failed to open KEY file." );
	}

	try
	{
		FileSize = GetFileSize( File, NULL );

		if ((FileSize == 0xFFFFFFFF) && (GetLastError( ) != NO_ERROR))
			throw std::exception( "Failed to read file size." );

		ParseKeyFile( File, InstallDir );
	}
	catch (...)
	{
		CloseHandle( File );

		throw;
	}

	CloseHandle( File );

#else

    File = fopen(FileName.c_str(),"r");

    if (File == nullptr)
        throw std::runtime_error( "Failed to open KEY file." );

    try
    {
        fseek(File, 0 , SEEK_END);
        FileSize = ftell(File);
        fseek(File, 0 , SEEK_SET);// needed for next read from beginning of file


        if ((FileSize == 0xFFFFFFFF))
            throw std::runtime_error( "Failed to read file size." );

        ParseKeyFile( File, InstallDir );
    }
    catch (...)
    {
        fclose( File );

        throw;
    }

    fclose( File );
#endif
}